

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O3

void __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::SimpleFilteredSentenceBreakIterator
          (SimpleFilteredSentenceBreakIterator *this,BreakIterator *adopt,UCharsTrie *forwards,
          UCharsTrie *backwards,UErrorCode *status)

{
  SimpleFilteredSentenceBreakData *pSVar1;
  Locale *valid;
  Locale LStack_1e8;
  Locale local_108;
  
  BreakIterator::getLocale(&local_108,adopt,ULOC_VALID_LOCALE,status);
  BreakIterator::getLocale(&LStack_1e8,adopt,ULOC_ACTUAL_LOCALE,status);
  valid = &local_108;
  BreakIterator::BreakIterator(&this->super_BreakIterator,valid,&LStack_1e8);
  Locale::~Locale(&LStack_1e8);
  Locale::~Locale(&local_108);
  (this->super_BreakIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__SimpleFilteredSentenceBreakIterator_003b6970;
  pSVar1 = (SimpleFilteredSentenceBreakData *)UMemory::operator_new((UMemory *)0x20,(size_t)valid);
  if (pSVar1 != (SimpleFilteredSentenceBreakData *)0x0) {
    pSVar1->_vptr_SimpleFilteredSentenceBreakData =
         (_func_int **)&PTR__SimpleFilteredSentenceBreakData_003b6950;
    (pSVar1->fForwardsPartialTrie).super_LocalPointerBase<icu_63::UCharsTrie>.ptr = forwards;
    (pSVar1->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>.ptr = backwards;
    pSVar1->refcount = 1;
  }
  this->fData = pSVar1;
  (this->fDelegate).super_LocalPointerBase<icu_63::BreakIterator>.ptr = adopt;
  (this->fText).super_LocalPointerBase<UText>.ptr = (UText *)0x0;
  return;
}

Assistant:

SimpleFilteredSentenceBreakIterator::SimpleFilteredSentenceBreakIterator(BreakIterator *adopt, UCharsTrie *forwards, UCharsTrie *backwards, UErrorCode &status) :
  BreakIterator(adopt->getLocale(ULOC_VALID_LOCALE,status),adopt->getLocale(ULOC_ACTUAL_LOCALE,status)),
  fData(new SimpleFilteredSentenceBreakData(forwards, backwards)),
  fDelegate(adopt)
{
  // all set..
}